

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getinfo.c
# Opt level: O1

CURLcode Curl_getinfo(Curl_easy *data,CURLINFO info,...)

{
  int iVar1;
  connectdata *pcVar2;
  double dVar3;
  curl_socket_t cVar4;
  curl_sslbackend cVar5;
  void *pvVar6;
  curl_slist *pcVar7;
  byte bVar8;
  char *pcVar9;
  char *pcVar10;
  CURLcode CVar11;
  curl_tlssessioninfo **tsip;
  curl_off_t *pcVar12;
  ip_quadruple *piVar13;
  va_list arg;
  double *local_c8;
  
  if (data == (Curl_easy *)0x0) {
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }
  CVar11 = CURLE_UNKNOWN_OPTION;
  switch((info & 0xf00000) - 0x100000 >> 0x14) {
  case CURLINFO_NONE:
    if (local_c8 == (double *)0x0) {
      return CURLE_UNKNOWN_OPTION;
    }
    if ((int)info < 0x10001e) {
      if (info == CURLINFO_EFFECTIVE_URL) {
        pcVar9 = (data->state).url;
        pcVar10 = "";
        if (pcVar9 != (char *)0x0) {
          pcVar10 = pcVar9;
        }
        *local_c8 = (double)pcVar10;
        goto LAB_0012fb21;
      }
      if (info == CURLINFO_CONTENT_TYPE) {
        pcVar9 = (data->info).contenttype;
      }
      else {
        if (info != CURLINFO_PRIVATE) {
          return CURLE_UNKNOWN_OPTION;
        }
        pcVar9 = (char *)(data->set).private_data;
      }
      goto LAB_0012fafa;
    }
    switch(info) {
    case CURLINFO_FTP_ENTRY_PATH:
      pcVar9 = (data->state).most_recent_ftp_entrypath;
      break;
    case CURLINFO_REDIRECT_URL:
      pcVar9 = (data->info).wouldredirect;
      break;
    case CURLINFO_PRIMARY_IP:
      piVar13 = &(data->info).primary;
      goto LAB_0012faca;
    case 0x100021:
    case 0x100022:
    case 0x100023:
    case 0x100025:
    case 0x100026:
    case 0x100027:
    case 0x100028:
      goto switchD_0012f368_default;
    case CURLINFO_RTSP_SESSION_ID:
      pcVar9 = (data->set).str[0x33];
      break;
    case CURLINFO_LOCAL_IP:
      piVar13 = (ip_quadruple *)(data->info).primary.local_ip;
LAB_0012faca:
      *local_c8 = (double)piVar13;
      goto LAB_0012fb21;
    default:
      switch(info) {
      case CURLINFO_EFFECTIVE_METHOD:
        pcVar9 = (data->set).str[0x1c];
        if (pcVar9 == (char *)0x0) {
          if (((data->set).field_0x8cd & 8) == 0) {
            bVar8 = (data->state).httpreq - 1;
            if (bVar8 < 5) {
              pcVar9 = &DAT_00179208 + *(int *)(&DAT_00179208 + (ulong)bVar8 * 4);
            }
            else {
              pcVar9 = "GET";
            }
          }
          else {
            pcVar9 = "HEAD";
          }
        }
        break;
      case 0x10003b:
        goto switchD_0012f368_default;
      case CURLINFO_REFERER:
        pcVar9 = (data->state).referer;
        break;
      case CURLINFO_CAINFO:
        pcVar9 = "/etc/ssl/certs/ca-certificates.crt";
        break;
      case CURLINFO_CAPATH:
        pcVar9 = "/etc/ssl/certs";
        break;
      default:
        if (info != CURLINFO_SCHEME) {
          return CURLE_UNKNOWN_OPTION;
        }
        pcVar9 = (data->info).conn_scheme;
      }
    }
LAB_0012fafa:
    *local_c8 = (double)pcVar9;
    goto LAB_0012fb21;
  case 1:
    if (local_c8 == (double *)0x0) {
      return CURLE_UNKNOWN_OPTION;
    }
    switch(info) {
    case CURLINFO_HEADER_SIZE:
      pcVar7 = (curl_slist *)(ulong)(data->info).header_size;
      break;
    case CURLINFO_REQUEST_SIZE:
      pcVar7 = (curl_slist *)(data->info).request_size;
      break;
    case CURLINFO_SSL_VERIFYRESULT:
      pcVar7 = (curl_slist *)(data->set).ssl.certverifyresult;
      break;
    case CURLINFO_FILETIME:
      pcVar7 = (curl_slist *)(data->info).filetime;
      break;
    case 0x20000f:
    case 0x200010:
    case 0x200011:
    case 0x200012:
    case 0x200013:
    case 0x200015:
    case 0x20001b:
    case 0x20001c:
    case 0x20001e:
    case 0x20001f:
    case 0x200020:
    case 0x200021:
    case 0x200022:
    case 0x200024:
    case 0x200029:
    case 0x20002b:
    case 0x20002c:
    case 0x20002d:
    case 0x200031:
    case 0x200032:
    case 0x200033:
    case 0x200034:
    case 0x200035:
    case 0x200036:
    case 0x200037:
    case 0x200038:
    case 0x200039:
    case 0x20003a:
      goto switchD_0012f368_default;
    case CURLINFO_REDIRECT_COUNT:
      pcVar7 = (curl_slist *)(data->state).followlocation;
      break;
    case CURLINFO_HTTP_CONNECTCODE:
      pcVar7 = (curl_slist *)(long)(data->info).httpproxycode;
      break;
    case CURLINFO_HTTPAUTH_AVAIL:
      pcVar7 = (curl_slist *)(data->info).httpauthavail;
      break;
    case CURLINFO_PROXYAUTH_AVAIL:
      pcVar7 = (curl_slist *)(data->info).proxyauthavail;
      break;
    case CURLINFO_OS_ERRNO:
      pcVar7 = (curl_slist *)(long)(data->state).os_errno;
      break;
    case CURLINFO_NUM_CONNECTS:
      pcVar7 = (curl_slist *)(data->info).numconnects;
      break;
    case CURLINFO_LASTSOCKET:
      cVar4 = Curl_getconnectinfo(data,(connectdata **)0x0);
      if (cVar4 != -1) {
        *local_c8 = (double)(long)cVar4;
        return CURLE_OK;
      }
      *local_c8 = -NAN;
      return CURLE_OK;
    case CURLINFO_CONDITION_UNMET:
      if ((data->info).httpcode != 0x130) {
        bVar8 = (data->info).field_0xe4;
LAB_0012fb1a:
        pcVar7 = (curl_slist *)(ulong)(bVar8 & 1);
        break;
      }
LAB_0012fb35:
      *local_c8 = 4.94065645841247e-324;
      goto LAB_0012fb21;
    case CURLINFO_RTSP_CLIENT_CSEQ:
      pcVar7 = (curl_slist *)(data->state).rtsp_next_client_CSeq;
      break;
    case CURLINFO_RTSP_SERVER_CSEQ:
      pcVar7 = (curl_slist *)(data->state).rtsp_next_server_CSeq;
      break;
    case CURLINFO_RTSP_CSEQ_RECV:
      pcVar7 = (curl_slist *)(data->state).rtsp_CSeq_recv;
      break;
    case CURLINFO_PRIMARY_PORT:
      pcVar7 = (curl_slist *)(long)(data->info).primary.remote_port;
      break;
    case CURLINFO_LOCAL_PORT:
      pcVar7 = (curl_slist *)(long)(data->info).primary.local_port;
      break;
    case CURLINFO_HTTP_VERSION:
      iVar1 = (data->info).httpversion;
      if (iVar1 < 0x14) {
        if (iVar1 == 10) goto LAB_0012fb35;
        if (iVar1 == 0xb) {
          *local_c8 = 9.88131291682493e-324;
        }
        else {
LAB_0012fb5d:
          *local_c8 = 0.0;
        }
      }
      else if (iVar1 == 0x14) {
        *local_c8 = 1.48219693752374e-323;
      }
      else {
        if (iVar1 != 0x1e) goto LAB_0012fb5d;
        *local_c8 = 1.48219693752374e-322;
      }
      goto LAB_0012fb21;
    case CURLINFO_PROXY_SSL_VERIFYRESULT:
      pcVar7 = (curl_slist *)(data->set).proxy_ssl.certverifyresult;
      break;
    case CURLINFO_PROTOCOL:
      pcVar7 = (curl_slist *)(ulong)(data->info).conn_protocol;
      break;
    case CURLINFO_PROXY_ERROR:
      pcVar7 = (curl_slist *)(ulong)(data->info).pxcode;
      break;
    default:
      if (info == CURLINFO_USED_PROXY) {
        bVar8 = (byte)(data->info).field_0xe4 >> 1;
        goto LAB_0012fb1a;
      }
      if (info != CURLINFO_RESPONSE_CODE) {
        return CURLE_UNKNOWN_OPTION;
      }
      pcVar7 = (curl_slist *)(long)(data->info).httpcode;
    }
LAB_0012fb1d:
    *local_c8 = (double)pcVar7;
    goto LAB_0012fb21;
  case 2:
    if (local_c8 == (double *)0x0) {
      return CURLE_UNKNOWN_OPTION;
    }
    break;
  case 3:
    if (local_c8 == (double *)0x0) {
      return CURLE_UNKNOWN_OPTION;
    }
    if ((int)info < 0x400022) {
      if (info == CURLINFO_SSL_ENGINES) {
        pcVar7 = Curl_ssl_engines_list(data);
      }
      else {
        if (info != CURLINFO_COOKIELIST) {
          return CURLE_UNKNOWN_OPTION;
        }
        pcVar7 = Curl_cookie_list(data);
      }
      goto LAB_0012fb1d;
    }
    if (info != CURLINFO_CERTINFO) {
      if ((info != CURLINFO_TLS_SESSION) && (info != CURLINFO_TLS_SSL_PTR)) {
        return CURLE_UNKNOWN_OPTION;
      }
      pcVar2 = data->conn;
      *local_c8 = (double)&data->tsi;
      cVar5 = Curl_ssl_backend();
      (data->tsi).backend = cVar5;
      (data->tsi).internals = (void *)0x0;
      if (cVar5 == CURLSSLBACKEND_NONE || pcVar2 == (connectdata *)0x0) {
        return CURLE_OK;
      }
      pvVar6 = Curl_ssl_get_internals(data,0,info,0);
      (data->tsi).internals = pvVar6;
      return CURLE_OK;
    }
    *local_c8 = (double)&(data->info).certs;
    goto LAB_0012fb21;
  case 4:
    if (info != CURLINFO_ACTIVESOCKET) {
      return CURLE_UNKNOWN_OPTION;
    }
    if (local_c8 == (double *)0x0) {
      return CURLE_UNKNOWN_OPTION;
    }
    cVar4 = Curl_getconnectinfo(data,(connectdata **)0x0);
    *(curl_socket_t *)local_c8 = cVar4;
    return CURLE_OK;
  case 5:
    if (local_c8 == (double *)0x0) {
      return CURLE_UNKNOWN_OPTION;
    }
    switch(info) {
    case CURLINFO_TOTAL_TIME_T:
      pcVar9 = (char *)(data->progress).timespent;
      break;
    case CURLINFO_NAMELOOKUP_TIME_T:
      pcVar9 = (char *)(data->progress).t_nslookup;
      break;
    case CURLINFO_CONNECT_TIME_T:
      pcVar9 = (char *)(data->progress).t_connect;
      break;
    case CURLINFO_PRETRANSFER_TIME_T:
      pcVar9 = (char *)(data->progress).t_pretransfer;
      break;
    case CURLINFO_STARTTRANSFER_TIME_T:
      pcVar9 = (char *)(data->progress).t_starttransfer;
      break;
    case CURLINFO_REDIRECT_TIME_T:
      pcVar9 = (char *)(data->progress).t_redirect;
      break;
    case CURLINFO_APPCONNECT_TIME_T:
      pcVar9 = (char *)(data->progress).t_appconnect;
      break;
    case CURLINFO_RETRY_AFTER:
      pcVar9 = (char *)(data->info).retry_after;
      break;
    case 0x60003a:
    case 0x60003b:
    case 0x60003c:
    case 0x60003d:
    case 0x60003e:
    case 0x600042:
      goto switchD_0012f368_default;
    case CURLINFO_XFER_ID:
      pcVar9 = (char *)data->id;
      break;
    case CURLINFO_CONN_ID:
      pcVar12 = &(data->state).recent_conn_id;
      if (data->conn != (connectdata *)0x0) {
        pcVar12 = &data->conn->connection_id;
      }
      pcVar9 = (char *)*pcVar12;
      break;
    case CURLINFO_QUEUE_TIME_T:
      pcVar9 = (char *)(data->progress).t_postqueue;
      break;
    case CURLINFO_POSTTRANSFER_TIME_T:
      pcVar9 = (char *)(data->progress).t_posttransfer;
      break;
    case CURLINFO_EARLYDATA_SENT_T:
      pcVar9 = (char *)(data->progress).earlydata_sent;
      break;
    default:
      switch(info) {
      case CURLINFO_SIZE_UPLOAD_T:
        pcVar9 = (char *)(data->progress).ul.cur_size;
        break;
      case CURLINFO_SIZE_DOWNLOAD_T:
        pcVar9 = (char *)(data->progress).dl.cur_size;
        break;
      case CURLINFO_SPEED_DOWNLOAD_T:
        pcVar9 = (char *)(data->progress).dl.speed;
        break;
      case CURLINFO_SPEED_UPLOAD_T:
        pcVar9 = (char *)(data->progress).ul.speed;
        break;
      default:
        goto switchD_0012f368_default;
      case CURLINFO_FILETIME_T:
        pcVar9 = (char *)(data->info).filetime;
        break;
      case CURLINFO_CONTENT_LENGTH_DOWNLOAD_T:
        pcVar9 = (char *)0xffffffffffffffff;
        if (((data->progress).flags & 0x40) != 0) {
          pcVar9 = (char *)(data->progress).dl.total_size;
        }
        break;
      case CURLINFO_CONTENT_LENGTH_UPLOAD_T:
        pcVar9 = (char *)0xffffffffffffffff;
        if (((data->progress).flags & 0x20) != 0) {
          pcVar9 = (char *)(data->progress).ul.total_size;
        }
      }
    }
    goto LAB_0012fafa;
  default:
    goto switchD_0012f368_default;
  }
  switch(info) {
  case CURLINFO_TOTAL_TIME:
    dVar3 = (double)(data->progress).timespent;
    break;
  case CURLINFO_NAMELOOKUP_TIME:
    dVar3 = (double)(data->progress).t_nslookup;
    break;
  case CURLINFO_CONNECT_TIME:
    dVar3 = (double)(data->progress).t_connect;
    break;
  case CURLINFO_PRETRANSFER_TIME:
    dVar3 = (double)(data->progress).t_pretransfer;
    break;
  case CURLINFO_SIZE_UPLOAD:
    dVar3 = (double)(data->progress).ul.cur_size;
    goto LAB_0012f80b;
  case CURLINFO_SIZE_DOWNLOAD:
    dVar3 = (double)(data->progress).dl.cur_size;
    goto LAB_0012f80b;
  case CURLINFO_SPEED_DOWNLOAD:
    dVar3 = (double)(data->progress).dl.speed;
    goto LAB_0012f80b;
  case CURLINFO_SPEED_UPLOAD:
    dVar3 = (double)(data->progress).ul.speed;
    goto LAB_0012f80b;
  default:
    goto switchD_0012f368_default;
  case CURLINFO_CONTENT_LENGTH_DOWNLOAD:
    if (((data->progress).flags & 0x40) == 0) {
LAB_0012f856:
      dVar3 = -1.0;
    }
    else {
      dVar3 = (double)(data->progress).dl.total_size;
    }
    goto LAB_0012f80b;
  case CURLINFO_CONTENT_LENGTH_UPLOAD:
    if (((data->progress).flags & 0x20) == 0) goto LAB_0012f856;
    dVar3 = (double)(data->progress).ul.total_size;
    goto LAB_0012f80b;
  case CURLINFO_STARTTRANSFER_TIME:
    dVar3 = (double)(data->progress).t_starttransfer;
    break;
  case CURLINFO_REDIRECT_TIME:
    dVar3 = (double)(data->progress).t_redirect;
    break;
  case CURLINFO_APPCONNECT_TIME:
    dVar3 = (double)(data->progress).t_appconnect;
  }
  dVar3 = dVar3 / 1000000.0;
LAB_0012f80b:
  *local_c8 = dVar3;
LAB_0012fb21:
  CVar11 = CURLE_OK;
switchD_0012f368_default:
  return CVar11;
}

Assistant:

CURLcode Curl_getinfo(struct Curl_easy *data, CURLINFO info, ...)
{
  va_list arg;
  long *param_longp = NULL;
  double *param_doublep = NULL;
  curl_off_t *param_offt = NULL;
  const char **param_charp = NULL;
  struct curl_slist **param_slistp = NULL;
  curl_socket_t *param_socketp = NULL;
  int type;
  CURLcode result = CURLE_UNKNOWN_OPTION;

  if(!data)
    return CURLE_BAD_FUNCTION_ARGUMENT;

  va_start(arg, info);

  type = CURLINFO_TYPEMASK & (int)info;
  switch(type) {
  case CURLINFO_STRING:
    param_charp = va_arg(arg, const char **);
    if(param_charp)
      result = getinfo_char(data, info, param_charp);
    break;
  case CURLINFO_LONG:
    param_longp = va_arg(arg, long *);
    if(param_longp)
      result = getinfo_long(data, info, param_longp);
    break;
  case CURLINFO_DOUBLE:
    param_doublep = va_arg(arg, double *);
    if(param_doublep)
      result = getinfo_double(data, info, param_doublep);
    break;
  case CURLINFO_OFF_T:
    param_offt = va_arg(arg, curl_off_t *);
    if(param_offt)
      result = getinfo_offt(data, info, param_offt);
    break;
  case CURLINFO_SLIST:
    param_slistp = va_arg(arg, struct curl_slist **);
    if(param_slistp)
      result = getinfo_slist(data, info, param_slistp);
    break;
  case CURLINFO_SOCKET:
    param_socketp = va_arg(arg, curl_socket_t *);
    if(param_socketp)
      result = getinfo_socket(data, info, param_socketp);
    break;
  default:
    break;
  }

  va_end(arg);

  return result;
}